

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrGetFaceExpressionWeights2FB
                   (XrFaceTracker2FB faceTracker,XrFaceExpressionInfo2FB *expressionInfo,
                   XrFaceExpressionWeights2FB *expressionWeights)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrFaceTracker2FB_T_*>::getWithInstanceInfo(&g_facetracker2fb_info,faceTracker);
  XVar1 = (*(pVar2.second)->dispatch_table->GetFaceExpressionWeights2FB)
                    (faceTracker,expressionInfo,expressionWeights);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrGetFaceExpressionWeights2FB(
    XrFaceTracker2FB faceTracker,
    const XrFaceExpressionInfo2FB* expressionInfo,
    XrFaceExpressionWeights2FB* expressionWeights) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_facetracker2fb_info.getWithInstanceInfo(faceTracker);
        GenValidUsageXrHandleInfo *gen_facetracker2fb_info = info_with_instance.first;
        (void)gen_facetracker2fb_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->GetFaceExpressionWeights2FB(faceTracker, expressionInfo, expressionWeights);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}